

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_State_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Minefield_State_PDU::Minefield_State_PDU(Minefield_State_PDU *this,KDataStream *stream)

{
  KDataStream *stream_local;
  Minefield_State_PDU *this_local;
  
  Minefield_Header::Minefield_Header(&this->super_Minefield_Header);
  (this->super_Minefield_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Minefield_State_PDU_00339710;
  DATA_TYPE::EntityType::EntityType(&this->m_MinefieldType);
  DATA_TYPE::WorldCoordinates::WorldCoordinates(&this->m_Loc);
  DATA_TYPE::EulerAngles::EulerAngles(&this->m_Ori);
  DATA_TYPE::MinefieldAppearance::MinefieldAppearance(&this->m_App);
  std::
  vector<KDIS::DATA_TYPE::PerimeterPointCoordinate,_std::allocator<KDIS::DATA_TYPE::PerimeterPointCoordinate>_>
  ::vector(&this->m_vPoints);
  std::vector<KDIS::DATA_TYPE::EntityType,_std::allocator<KDIS::DATA_TYPE::EntityType>_>::vector
            (&this->m_vMineTypes);
  (*(this->super_Minefield_Header).super_Header.super_Header6._vptr_Header6[3])(this,stream,0);
  return;
}

Assistant:

Minefield_State_PDU::Minefield_State_PDU(KDataStream &stream) noexcept(false)
{
    Decode( stream, false );
}